

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O0

weak_ptr<squall::detail::KlassImp<Foo>_> __thiscall
squall::KlassTable::add_klass<Foo,void>(KlassTable *this,HSQUIRRELVM vm,string *name)

{
  bool bVar1;
  mapped_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  weak_ptr<squall::detail::KlassImp<Foo>_> wVar3;
  shared_ptr<squall::detail::KlassImp<Foo>_> local_70 [2];
  undefined1 local_50 [8];
  shared_ptr<squall::detail::KlassImp<Foo>_> p;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
  local_38;
  iterator i;
  size_t h;
  string *name_local;
  HSQUIRRELVM vm_local;
  KlassTable *this_local;
  
  i.
  super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
             )detail::KlassImp<Foo>::hash();
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
       ::find((unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
               *)vm,(key_type *)&i);
  p.super___shared_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
         ::end((unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
                *)vm);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                      *)&p.
                         super___shared_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  if (bVar1) {
    KlassAdd<Foo,_void>::doit((klasses_type *)local_50,vm,name);
    this_00 = std::
              unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
              ::operator[]((unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
                            *)vm,(key_type *)&i);
    std::shared_ptr<squall::detail::KlassImpBase>::operator=
              (this_00,(shared_ptr<squall::detail::KlassImp<Foo>_> *)local_50);
    std::weak_ptr<squall::detail::KlassImp<Foo>>::weak_ptr<squall::detail::KlassImp<Foo>,void>
              ((weak_ptr<squall::detail::KlassImp<Foo>> *)this,
               (shared_ptr<squall::detail::KlassImp<Foo>_> *)local_50);
    std::shared_ptr<squall::detail::KlassImp<Foo>_>::~shared_ptr
              ((shared_ptr<squall::detail::KlassImp<Foo>_> *)local_50);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false,_false>
    ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false,_false>
                 *)&local_38);
    std::dynamic_pointer_cast<squall::detail::KlassImp<Foo>,squall::detail::KlassImpBase>
              ((shared_ptr<squall::detail::KlassImpBase> *)local_70);
    std::weak_ptr<squall::detail::KlassImp<Foo>>::weak_ptr<squall::detail::KlassImp<Foo>,void>
              ((weak_ptr<squall::detail::KlassImp<Foo>> *)this,local_70);
    std::shared_ptr<squall::detail::KlassImp<Foo>_>::~shared_ptr(local_70);
    _Var2._M_pi = extraout_RDX_00;
  }
  wVar3.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  wVar3.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<squall::detail::KlassImp<Foo>_>)
         wVar3.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<detail::KlassImp<typename std::remove_cv<C>::type>>
    add_klass(HSQUIRRELVM vm, const string& name) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            auto p = KlassAdd<CC, Base>::doit(klasses_, vm, name);
            klasses_[h] = p;
            return p;
        } else {
            return std::dynamic_pointer_cast<detail::KlassImp<CC>>(
                (*i).second);
        }
    }